

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O2

void __thiscall
toml::basic_value<toml::type_config>::basic_value
          (basic_value<toml::type_config> *this,basic_value<toml::type_config> *v)

{
  value_type_conflict5 vVar1;
  size_type sVar2;
  undefined8 uVar3;
  uint8_t uVar4;
  anon_union_64_11_c2653db1_for_basic_value<toml::type_config>_2 *this_00;
  
  this->type_ = v->type_;
  detail::region::region(&this->region_,&v->region_);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&this->comments_,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&v->comments_);
  this_00 = &this->field_1;
  switch(this->type_) {
  case boolean:
    (this_00->offset_datetime_).value.date.year = (int16_t)(v->field_1).boolean_;
    break;
  case integer:
    detail::value_with_format<long,_toml::integer_format_info>::value_with_format
              ((value_with_format<long,_toml::integer_format_info> *)&this_00->boolean_,
               (value_with_format<long,_toml::integer_format_info> *)&(v->field_1).boolean_);
    break;
  case floating:
    detail::value_with_format<double,_toml::floating_format_info>::value_with_format
              ((value_with_format<double,_toml::floating_format_info> *)&this_00->boolean_,
               (value_with_format<double,_toml::floating_format_info> *)&(v->field_1).boolean_);
    break;
  case string:
    detail::
    value_with_format<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::string_format_info>
    ::value_with_format((value_with_format<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::string_format_info>
                         *)&this_00->boolean_,
                        (value_with_format<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::string_format_info>
                         *)&(v->field_1).boolean_);
    break;
  case offset_datetime:
  case local_datetime:
  case local_time:
    vVar1 = (v->field_1).integer_.value;
    sVar2 = (v->field_1).string_.value._M_string_length;
    uVar3 = *(undefined8 *)((long)&(v->field_1).string_.value.field_2 + 8);
    (this->field_1).string_.value.field_2._M_allocated_capacity =
         (v->field_1).string_.value.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&(this->field_1).string_.value.field_2 + 8) = uVar3;
    (this_00->integer_).value = vVar1;
    (this->field_1).string_.value._M_string_length = sVar2;
    break;
  case local_date:
    uVar4 = *(uint8_t *)((long)&v->field_1 + 5);
    *(uint8_t *)((long)&this->field_1 + 4) = *(uint8_t *)((long)&v->field_1 + 4);
    *(uint8_t *)((long)&this->field_1 + 5) = uVar4;
    (this_00->offset_datetime_).value.date = (v->field_1).offset_datetime_.value.date;
    break;
  case array:
    detail::
    value_with_format<toml::detail::storage<std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>,_toml::array_format_info>
    ::value_with_format((value_with_format<toml::detail::storage<std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>,_toml::array_format_info>
                         *)&this_00->boolean_,
                        (value_with_format<toml::detail::storage<std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>,_toml::array_format_info>
                         *)&(v->field_1).boolean_);
    break;
  case table:
    detail::
    value_with_format<toml::detail::storage<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>_>,_toml::table_format_info>
    ::value_with_format((value_with_format<toml::detail::storage<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>_>,_toml::table_format_info>
                         *)&this_00->boolean_,
                        (value_with_format<toml::detail::storage<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>_>,_toml::table_format_info>
                         *)&(v->field_1).boolean_);
    break;
  default:
    (this_00->boolean_).value = false;
  }
  return;
}

Assistant:

basic_value(const basic_value& v)
        : type_(v.type_), region_(v.region_), comments_(v.comments_)
    {
        switch(this->type_)
        {
            case value_t::boolean        : assigner(boolean_        , v.boolean_        ); break;
            case value_t::integer        : assigner(integer_        , v.integer_        ); break;
            case value_t::floating       : assigner(floating_       , v.floating_       ); break;
            case value_t::string         : assigner(string_         , v.string_         ); break;
            case value_t::offset_datetime: assigner(offset_datetime_, v.offset_datetime_); break;
            case value_t::local_datetime : assigner(local_datetime_ , v.local_datetime_ ); break;
            case value_t::local_date     : assigner(local_date_     , v.local_date_     ); break;
            case value_t::local_time     : assigner(local_time_     , v.local_time_     ); break;
            case value_t::array          : assigner(array_          , v.array_          ); break;
            case value_t::table          : assigner(table_          , v.table_          ); break;
            default                      : assigner(empty_          , '\0'              ); break;
        }
    }